

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int __thiscall
IDisk::AddByteToSpecificTrack(IDisk *this,int side,uint track,uint index,uchar byte,int size)

{
  int iVar1;
  uchar local_48 [4];
  int nb_byte_to_last_track;
  uchar buffer [16];
  int size_local;
  uchar byte_local;
  uint index_local;
  uint track_local;
  int side_local;
  IDisk *this_local;
  
  if (index + size < this->side_[side].tracks[track].size) {
    this_local._4_4_ =
         AddByteToTrackInBits
                   (this->side_[side].tracks[track].bitfield,index,byte,size,
                    this->side_[side].tracks[track].size);
  }
  else {
    iVar1 = this->side_[side].tracks[track].size - index;
    if (iVar1 < 1) {
      this_local._4_4_ = 0;
    }
    else {
      if (index == 0) {
        AddByteToTrack(local_48,0,byte,8,'\0');
      }
      else {
        AddByteToTrack(local_48,0,byte,8,this->side_[side].tracks[track].bitfield[index - 1]);
      }
      memcpy(this->side_[side].tracks[track].bitfield + index,local_48,(long)iVar1);
      memcpy(this->side_[side].tracks[track].bitfield,local_48 + iVar1,(long)(size - iVar1));
      this_local._4_4_ = size - iVar1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int IDisk::AddByteToSpecificTrack(int side, unsigned int track, unsigned int index, unsigned char byte, int size)
{
   if (index + size >= side_[side].tracks[track].size)
   {
      unsigned char buffer[16];

      const int nb_byte_to_last_track = side_[side].tracks[track].size - index;

      if (nb_byte_to_last_track > 0)
      {
         // Index should be far more than 0 ! Otherwiser, track is about 16 bit long ??
         if (index > 0)
         {
            AddByteToTrack(buffer, 0, byte, 8, side_[side].tracks[track].bitfield[index - 1]);
         }
         else
         {
            AddByteToTrack(buffer, 0, byte, 8, 0);
         }
         memcpy(&side_[side].tracks[track].bitfield[index], buffer, nb_byte_to_last_track);

         // Copy remaining to begining of the track ?
         memcpy(&side_[side].tracks[track].bitfield[0], &buffer[nb_byte_to_last_track], size - nb_byte_to_last_track);
         return (size) - nb_byte_to_last_track;
      }
      // TODO !
      return 0;
   }
   return AddByteToTrackInBits(side_[side].tracks[track].bitfield, index, byte, size, side_[side].tracks[track].size);
}